

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::BufferSubData::exec(BufferSubData *this,Thread *t)

{
  GLenum GVar1;
  code *pcVar2;
  deUint32 dVar3;
  deBool dVar4;
  MessageBuilder *pMVar5;
  Buffer *pBVar6;
  MessageBuilder local_998;
  MessageBuilder local_808;
  MessageBuilder local_678;
  MessageBuilder local_4e8;
  MessageBuilder local_358;
  MessageBuilder local_1b8;
  deUint8 *local_28;
  void *dummyData;
  EGLThread *thread;
  Thread *t_local;
  BufferSubData *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  dummyData = (void *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if ((Thread *)dummyData == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  local_28 = tcu::ThreadUtil::Thread::getDummyData((Thread *)dummyData,this->m_size);
  tcu::ThreadUtil::Thread::newMessage(&local_1b8,(Thread *)dummyData);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b8,(char (*) [23])"Begin -- glBindBuffer(");
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,&this->m_target);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x584b6d);
  pBVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::operator->(&this->m_buffer);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,&pBVar6->buffer);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x5b492c);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b8);
  do {
    pcVar2 = *(code **)(*(long *)((long)dummyData + 0x88) + 0x40);
    GVar1 = this->m_target;
    pBVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::operator->(&this->m_buffer);
    (*pcVar2)(GVar1,pBVar6->buffer);
    dVar3 = (**(code **)(*(long *)((long)dummyData + 0x88) + 0x800))();
    glu::checkError(dVar3,"bindBuffer(m_target, m_buffer->buffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x516);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_358,(Thread *)dummyData);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_358,(char (*) [22])"End -- glBindBuffer()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_358);
  tcu::ThreadUtil::Thread::newMessage(&local_4e8,(Thread *)dummyData);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_4e8,(char (*) [26])"Begin -- glBufferSubData(");
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,&this->m_target);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x584b6d);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,&this->m_offset);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x584b6d);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,&this->m_size);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(char (*) [10])", <DATA>)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_4e8);
  do {
    (**(code **)(*(long *)((long)dummyData + 0x88) + 0x168))
              (this->m_target,this->m_offset,this->m_size,local_28);
    dVar3 = (**(code **)(*(long *)((long)dummyData + 0x88) + 0x800))();
    glu::checkError(dVar3,"bufferSubData(m_target, m_offset, m_size, dummyData)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x51a);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_678,(Thread *)dummyData);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_678,(char (*) [25])"End -- glBufferSubData()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_678);
  tcu::ThreadUtil::Thread::newMessage(&local_808,(Thread *)dummyData);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_808,(char (*) [23])"Begin -- glBindBuffer(");
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,&this->m_target);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(char (*) [5])0x57ec09);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_808);
  do {
    (**(code **)(*(long *)((long)dummyData + 0x88) + 0x40))(this->m_target,0);
    dVar3 = (**(code **)(*(long *)((long)dummyData + 0x88) + 0x800))();
    glu::checkError(dVar3,"bindBuffer(m_target, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x51e);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_998,(Thread *)dummyData);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_998,(char (*) [22])"End -- glBindBuffer()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_998);
  return;
}

Assistant:

void BufferSubData::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	void* dummyData = thread.getDummyData(m_size);

	thread.newMessage() << "Begin -- glBindBuffer(" << m_target << ", " << m_buffer->buffer << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindBuffer(m_target, m_buffer->buffer));
	thread.newMessage() << "End -- glBindBuffer()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBufferSubData(" << m_target << ", " << m_offset << ", " << m_size << ", <DATA>)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bufferSubData(m_target, m_offset, m_size, dummyData));
	thread.newMessage() << "End -- glBufferSubData()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindBuffer(" << m_target << ", 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindBuffer(m_target, 0));
	thread.newMessage() << "End -- glBindBuffer()" << tcu::ThreadUtil::Message::End;
}